

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__horizontal_gather_7_channels_with_4_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  long lVar38;
  
  pfVar1 = output_buffer + output_sub_size * 7;
  do {
    lVar38 = (long)horizontal_contributors->n0;
    fVar6 = *horizontal_coefficients;
    fVar7 = horizontal_coefficients[1];
    fVar8 = horizontal_coefficients[2];
    fVar9 = horizontal_coefficients[3];
    pfVar2 = decode_buffer + lVar38 * 7;
    fVar10 = *pfVar2;
    fVar11 = pfVar2[1];
    fVar12 = pfVar2[2];
    fVar13 = pfVar2[3];
    pfVar2 = decode_buffer + lVar38 * 7 + 3;
    fVar14 = pfVar2[1];
    fVar15 = pfVar2[2];
    fVar16 = pfVar2[3];
    pfVar3 = decode_buffer + lVar38 * 7 + 7;
    fVar17 = *pfVar3;
    fVar18 = pfVar3[1];
    fVar19 = pfVar3[2];
    fVar20 = pfVar3[3];
    pfVar3 = decode_buffer + lVar38 * 7 + 10;
    fVar21 = pfVar3[1];
    fVar22 = pfVar3[2];
    fVar23 = pfVar3[3];
    pfVar4 = decode_buffer + lVar38 * 7 + 0xe;
    fVar24 = *pfVar4;
    fVar25 = pfVar4[1];
    fVar26 = pfVar4[2];
    fVar27 = pfVar4[3];
    pfVar4 = decode_buffer + lVar38 * 7 + 0x11;
    fVar28 = pfVar4[1];
    fVar29 = pfVar4[2];
    fVar30 = pfVar4[3];
    pfVar5 = decode_buffer + lVar38 * 7 + 0x15;
    fVar31 = *pfVar5;
    fVar32 = pfVar5[1];
    fVar33 = pfVar5[2];
    fVar34 = pfVar5[3];
    pfVar5 = decode_buffer + lVar38 * 7 + 0x18;
    fVar35 = pfVar5[1];
    fVar36 = pfVar5[2];
    fVar37 = pfVar5[3];
    output_buffer[3] = *pfVar5 * fVar9 + fVar7 * *pfVar3 + *pfVar4 * fVar8 + *pfVar2 * fVar6;
    output_buffer[4] = fVar35 * fVar9 + fVar7 * fVar21 + fVar28 * fVar8 + fVar14 * fVar6;
    output_buffer[5] = fVar36 * fVar9 + fVar7 * fVar22 + fVar29 * fVar8 + fVar15 * fVar6;
    output_buffer[6] = fVar37 * fVar9 + fVar7 * fVar23 + fVar30 * fVar8 + fVar16 * fVar6;
    *output_buffer = fVar31 * fVar9 + fVar17 * fVar7 + fVar24 * fVar8 + fVar10 * fVar6;
    output_buffer[1] = fVar32 * fVar9 + fVar18 * fVar7 + fVar25 * fVar8 + fVar11 * fVar6;
    output_buffer[2] = fVar33 * fVar9 + fVar19 * fVar7 + fVar26 * fVar8 + fVar12 * fVar6;
    output_buffer[3] = fVar34 * fVar9 + fVar20 * fVar7 + fVar27 * fVar8 + fVar13 * fVar6;
    horizontal_contributors = horizontal_contributors + 1;
    output_buffer = output_buffer + 7;
    horizontal_coefficients = horizontal_coefficients + coefficient_width;
  } while (output_buffer < pfVar1);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_4_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;
    stbir__4_coeff_start();
    stbir__store_output();
  } while ( output < output_end );
}